

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DArrayCase::verify
          (TextureGather2DArrayCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *stream;
  ostringstream *this_00;
  GatherType gatherType;
  TextureType TVar1;
  ChannelOrder CVar2;
  ChannelType CVar3;
  int this_01 [2];
  PixelOffsets *pPVar4;
  bool bVar5;
  undefined7 extraout_var;
  MessageBuilder *this_02;
  ulong uVar6;
  _anonymous_namespace_ *__n;
  Surface *pSVar7;
  ConstPixelBufferAccess *pCVar8;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  uint uVar9;
  float fVar10;
  int __fd;
  Vector<int,_4> *a;
  int px;
  float fVar11;
  int px_3;
  long lVar12;
  pointer gatherArgs;
  float fVar13;
  undefined4 uVar14;
  Vector<float,_3> VVar15;
  allocator<char> local_47e;
  allocator<char> local_47d;
  float local_47c;
  Vector<bool,_4> local_478;
  Vector<bool,_4> local_474;
  uint local_470;
  float local_46c;
  float local_468;
  float local_464;
  ConstPixelBufferAccess *local_460;
  Surface ideal;
  Vec2 viewportCoord;
  string local_418;
  IVec3 uvwBits;
  IVec3 coordBits;
  Vector<float,_3> texCoord;
  Surface errorMask_1;
  Surface errorMask;
  undefined1 local_370 [16];
  TexComparePrecision comparePrec;
  PixelBufferAccess idealAccess;
  Vector<bool,_4> local_308 [2];
  Vec4 idealPix;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
  local_2d8;
  Vec4 resultPix;
  Vec4 refColor;
  IVec2 offsets [4];
  Vec3 texCoords [4];
  IVec4 colorBits;
  
  lVar12 = 0;
  local_460 = (ConstPixelBufferAccess *)sig;
  do {
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)texCoords[0].m_data + lVar12));
    lVar12 = lVar12 + 0xc;
  } while (lVar12 != 0x30);
  (*(this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
            ((_Vector_base<float,_std::allocator<float>_> *)offsets,this,(ulong)ctx & 0xffffffff);
  computeTexCoordVecs<3>((vector<float,_std::allocator<float>_> *)offsets,&texCoords);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)offsets);
  tcu::Texture2DArrayView::Texture2DArrayView
            ((Texture2DArrayView *)offsets,1,
             (this->m_swizzledTexture).m_view.m_levels + (this->super_TextureGatherCase).m_baseLevel
            );
  local_370._0_4_ = offsets[0].m_data[0];
  local_370._8_4_ = offsets[1].m_data[0];
  local_370._12_4_ = offsets[1].m_data[1];
  this_01 = (int  [2])
            ((this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
            ->m_log;
  gatherArgs = (this->m_iterations).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)ctx;
  if (((this->super_TextureGatherCase).m_flags & 1) != 0) {
    uVar9 = (gatherArgs->gatherArgs).componentNdx;
    uVar6 = 0;
    if (0 < (int)uVar9) {
      uVar6 = (ulong)uVar9;
    }
    resultPix.m_data[0] = 0.0;
    resultPix.m_data[1] = 0.0;
    resultPix.m_data[2] = 0.0;
    resultPix.m_data[3] = 1.0;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&refColor,resultPix.m_data[uVar6]);
    bVar5 = verifySingleColored((anon_unknown_0 *)this_01,(TestLog *)local_460,
                                (ConstPixelBufferAccess *)&refColor,(Vec4 *)offsets[1].m_data);
    uVar9 = (uint)CONCAT71(extraout_var,bVar5);
    if (!bVar5) {
      this_00 = (ostringstream *)(offsets + 1);
      offsets[0].m_data = this_01;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Note: expected color ");
      tcu::operator<<((ostream *)this_00,&refColor);
      std::operator<<((ostream *)this_00," for all pixels; ");
      this_02 = tcu::MessageBuilder::operator<<((MessageBuilder *)offsets,resultPix.m_data + uVar6);
      stream = &this_02->m_str;
      std::operator<<((ostream *)stream," is component at index ");
      std::ostream::operator<<(stream,(int)uVar6);
      std::operator<<((ostream *)stream," in the color ");
      tcu::operator<<((ostream *)stream,&resultPix);
      std::operator<<((ostream *)stream,", which is used for incomplete textures");
      tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    goto LAB_005879b0;
  }
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)offsets);
  makePixelOffsetsFunctor(&local_2d8,gatherType,&gatherArgs->gatherArgs,offsets);
  resultPix.m_data[0] = 1.12104e-44;
  resultPix.m_data[1] = 1.12104e-44;
  resultPix.m_data[2] = 1.12104e-44;
  resultPix.m_data[3] = 1.12104e-44;
  tcu::operator-((tcu *)offsets,(Vector<int,_4> *)&resultPix,1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&refColor,0);
  a = (Vector<int,_4> *)offsets;
  tcu::max<int,4>((tcu *)&colorBits,a,(Vector<int,_4> *)&refColor);
  TVar1 = (this->super_TextureGatherCase).m_textureType;
  if (TVar1 == TEXTURETYPE_2D_ARRAY) {
    coordBits.m_data[0] = 0x14;
    coordBits.m_data[1] = 0x14;
    coordBits.m_data[2] = 0x14;
LAB_005867fa:
    uvwBits.m_data[0] = 7;
    uvwBits.m_data[1] = 7;
    uvwBits.m_data[2] = 7;
  }
  else {
    if (TVar1 == TEXTURETYPE_CUBE) {
      coordBits.m_data[0] = 10;
      coordBits.m_data[1] = 10;
      coordBits.m_data[2] = 10;
LAB_005867cb:
      uvwBits.m_data[0] = 6;
      uvwBits.m_data[1] = 6;
    }
    else {
      if (TVar1 != TEXTURETYPE_2D) {
        a = (Vector<int,_4> *)0xffffffffffffffff;
        tcu::Vector<int,_3>::Vector(&coordBits,-1);
        TVar1 = (this->super_TextureGatherCase).m_textureType;
        if (TVar1 == TEXTURETYPE_2D_ARRAY) goto LAB_005867fa;
        if (TVar1 == TEXTURETYPE_CUBE) goto LAB_005867cb;
        if (TVar1 == TEXTURETYPE_2D) goto LAB_00586691;
        a = (Vector<int,_4> *)0xffffffffffffffff;
        tcu::Vector<int,_3>::Vector(&uvwBits,-1);
        goto LAB_0058680d;
      }
      coordBits.m_data[0] = 0x14;
      coordBits.m_data[1] = 0x14;
      coordBits.m_data[2] = 0;
LAB_00586691:
      uvwBits.m_data[0] = 7;
      uvwBits.m_data[1] = 7;
    }
    uvwBits.m_data[2] = 0;
  }
LAB_0058680d:
  refColor.m_data[2] = 9.80909e-45;
  refColor.m_data[3] = 8.40779e-45;
  refColor.m_data[0] = (float)(this->super_TextureGatherCase).m_wrapS;
  refColor.m_data[1] = (float)(this->super_TextureGatherCase).m_wrapT;
  CVar2 = (this->super_TextureGatherCase).m_textureFormat.order;
  __fd = this_01[0];
  if ((CVar2 == DS) || (CVar2 == D)) {
    tcu::TexComparePrecision::TexComparePrecision(&comparePrec);
    comparePrec.coordBits.m_data[2] = coordBits.m_data[2];
    comparePrec.coordBits.m_data[0] = coordBits.m_data[0];
    comparePrec.coordBits.m_data[1] = coordBits.m_data[1];
    comparePrec.uvwBits.m_data[0] = uvwBits.m_data[0];
    comparePrec.uvwBits.m_data[1] = uvwBits.m_data[1];
    comparePrec.uvwBits.m_data[2] = uvwBits.m_data[2];
    comparePrec.referenceBits = 0x10;
    comparePrec.resultBits = 7;
    PixelCompareRefZDefault::PixelCompareRefZDefault
              ((PixelCompareRefZDefault *)&errorMask_1,(IVec2 *)a);
    pPVar4 = local_2d8.
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
             .m_data.ptr;
    local_47c = (float)(local_460->m_size).m_data[0];
    tcu::Surface::Surface(&ideal,(int)local_47c,(int)local_47c);
    tcu::Surface::getAccess(&idealAccess,&ideal);
    tcu::Surface::Surface(&errorMask,(int)local_47c,(int)local_47c);
    tcu::Surface::getAccess((PixelBufferAccess *)offsets,&errorMask);
    idealPix.m_data[0] = -1.7146522e+38;
    tcu::RGBA::toVec((RGBA *)&idealPix);
    tcu::clear((PixelBufferAccess *)offsets,&resultPix);
    local_468 = (float)(int)local_47c;
    fVar10 = 0.0;
    __n = (_anonymous_namespace_ *)0x0;
    if (0 < (int)local_47c) {
      __n = (_anonymous_namespace_ *)(ulong)(uint)local_47c;
    }
    fVar13 = SUB84(__n,0);
    local_470 = (uint)CONCAT71((uint7)(uint3)((uint)local_47c >> 8),1);
    for (; fVar10 != fVar13; fVar10 = (float)((int)fVar10 + 1)) {
      local_464 = (float)(int)fVar10;
      for (fVar11 = 0.0; local_47c != fVar11; fVar11 = (float)((int)fVar11 + 1)) {
        offsets[2].m_data[0] = 0;
        offsets[2].m_data[1] = 0;
        offsets[3].m_data[0] = 0;
        offsets[3].m_data[1] = 0;
        offsets[0].m_data[0] = 0;
        offsets[0].m_data[1] = 0;
        offsets[1].m_data[0] = 0;
        offsets[1].m_data[1] = 0;
        resultPix.m_data[1] = fVar10;
        resultPix.m_data[0] = fVar11;
        (**pPVar4->_vptr_PixelOffsets)(pPVar4,(ConstPixelBufferAccess *)&resultPix,offsets);
        idealPix.m_data[0] = (float)(int)fVar11;
        idealPix.m_data[1] = local_464;
        tcu::operator+(0.5,(Vector<float,_2> *)&idealPix);
        texCoord.m_data[0] = local_468;
        texCoord.m_data[1] = local_468;
        tcu::operator/((Vector<float,_2> *)&resultPix,(Vector<float,_2> *)&texCoord);
        uVar14 = 0;
        VVar15 = (anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,3>>
                           ((_anonymous_namespace_ *)&texCoord,&texCoords,viewportCoord.m_data[0],
                            viewportCoord.m_data[1]);
        local_46c = (float)(**(code **)CONCAT44(errorMask_1.m_height,errorMask_1.m_width))
                                     (VVar15.m_data[0],CONCAT44(uVar14,VVar15.m_data[2]),
                                      &errorMask_1,(ConstPixelBufferAccess *)&resultPix);
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)&resultPix,(int)local_460,(int)fVar11,(int)fVar10);
        tcu::Texture2DArrayView::gatherOffsetsCompare
                  ((Texture2DArrayView *)&idealPix,(Sampler *)local_370,local_46c,texCoord.m_data[0]
                   ,texCoord.m_data[1],texCoord.m_data[2],(IVec2 (*) [4])&refColor);
        __n = (_anonymous_namespace_ *)(ulong)(uint)fVar10;
        tcu::PixelBufferAccess::setPixel(&idealAccess,&idealPix,(int)fVar11,(int)fVar10,0);
        tcu::equal<float,4>((tcu *)&local_418,(Vector<float,_4> *)&resultPix,
                            (Vector<float,_4> *)&idealPix);
        bVar5 = tcu::boolAll<4>((Vector<bool,_4> *)&local_418);
        if ((!bVar5) &&
           (__n = (_anonymous_namespace_ *)&texCoord,
           bVar5 = tcu::isGatherOffsetsCompareResultValid
                             ((Texture2DArrayView *)local_370,(Sampler *)&refColor,&comparePrec,
                              (Vec3 *)&texCoord,&offsets,local_46c,&resultPix), !bVar5)) {
          *(undefined4 *)
           ((long)errorMask.m_pixels.m_ptr +
           (long)(errorMask.m_width * (int)fVar10 + (int)fVar11) * 4) = 0xff0000ff;
          local_470 = 0;
          __n = (_anonymous_namespace_ *)errorMask.m_pixels.m_ptr;
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&idealPix,"VerifyResult",(allocator<char> *)&local_474);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&texCoord,"Verification result",(allocator<char> *)&local_478);
    uVar9 = local_470;
    tcu::LogImageSet::LogImageSet((LogImageSet *)&resultPix,(string *)&idealPix,(string *)&texCoord)
    ;
    tcu::LogImageSet::write((LogImageSet *)&resultPix,__fd,__buf,(size_t)__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&viewportCoord,"Rendered",&local_47e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"Rendered image",&local_47d);
    pCVar8 = local_460;
    tcu::LogImage::LogImage
              ((LogImage *)offsets,(string *)&viewportCoord,&local_418,local_460,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)offsets,__fd,__buf_00,(size_t)pCVar8);
    tcu::LogImage::~LogImage((LogImage *)offsets);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&viewportCoord);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultPix);
    std::__cxx11::string::~string((string *)&texCoord);
    std::__cxx11::string::~string((string *)&idealPix);
    if ((uVar9 & 1) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&idealPix,"Reference",(allocator<char> *)&local_474);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texCoord,"Ideal reference image",(allocator<char> *)&local_478);
      pSVar7 = &ideal;
      tcu::LogImage::LogImage
                ((LogImage *)offsets,(string *)&idealPix,(string *)&texCoord,pSVar7,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)offsets,__fd,__buf_01,(size_t)pSVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord,"ErrorMask",&local_47e);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_418,"Error mask",&local_47d);
      pSVar7 = &errorMask;
      tcu::LogImage::LogImage
                ((LogImage *)&resultPix,(string *)&viewportCoord,&local_418,pSVar7,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&resultPix,__fd,__buf_02,(size_t)pSVar7);
      tcu::LogImage::~LogImage((LogImage *)&resultPix);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&viewportCoord);
      tcu::LogImage::~LogImage((LogImage *)offsets);
      std::__cxx11::string::~string((string *)&texCoord);
      std::__cxx11::string::~string((string *)&idealPix);
    }
    tcu::TestLog::endImageSet((TestLog *)this_01);
    tcu::Surface::~Surface(&errorMask);
    tcu::Surface::~Surface(&ideal);
  }
  else {
    fVar10 = (float)(gatherArgs->gatherArgs).componentNdx;
    local_46c = 0.0;
    if (0 < (int)fVar10) {
      local_46c = fVar10;
    }
    CVar3 = (this->super_TextureGatherCase).m_textureFormat.type;
    uVar6 = (ulong)CVar3;
    if (uVar6 < 0x22) {
      if ((0x58UL >> (uVar6 & 0x3f) & 1) == 0) {
        if ((0x2c0000000U >> (uVar6 & 0x3f) & 1) == 0) goto LAB_005879c8;
        goto LAB_00586e2b;
      }
      tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&idealAccess);
      tcu::computeFixedPointThreshold((tcu *)offsets,&colorBits);
      pPVar4 = local_2d8.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
               .m_data.ptr;
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = offsets[0].m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = offsets[0].m_data[1];
      idealAccess.super_ConstPixelBufferAccess.m_data = (void *)offsets[1].m_data;
      idealAccess.super_ConstPixelBufferAccess.m_format.order = coordBits.m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_format.type = coordBits.m_data[1];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = coordBits.m_data[2];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = uvwBits.m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = uvwBits.m_data[1];
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = uvwBits.m_data[2];
      local_308[0].m_data[0] = true;
      local_308[0].m_data[1] = true;
      local_308[0].m_data[2] = true;
      local_308[0].m_data[3] = true;
      local_47c = (float)(local_460->m_size).m_data[0];
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)&comparePrec,&local_460->m_format,(int)local_47c,(int)local_47c,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&idealPix,(TextureLevel *)&comparePrec);
      tcu::Surface::Surface(&errorMask_1,(int)local_47c,(int)local_47c);
      tcu::Surface::getAccess((PixelBufferAccess *)offsets,&errorMask_1);
      texCoord.m_data[0] = -1.7146522e+38;
      tcu::RGBA::toVec((RGBA *)&texCoord);
      tcu::clear((PixelBufferAccess *)offsets,&resultPix);
      fVar13 = (float)(int)local_47c;
      fVar10 = 0.0;
      pSVar7 = (Surface *)0x0;
      if (0 < (int)local_47c) {
        pSVar7 = (Surface *)(ulong)(uint)local_47c;
      }
      local_468 = SUB84(pSVar7,0);
      local_470 = (uint)CONCAT71((uint7)(uint3)((uint)local_47c >> 8),1);
      for (; fVar10 != local_468; fVar10 = (float)((int)fVar10 + 1)) {
        local_464 = (float)(int)fVar10;
        for (fVar11 = 0.0; local_47c != fVar11; fVar11 = (float)((int)fVar11 + 1)) {
          offsets[2].m_data[0] = 0;
          offsets[2].m_data[1] = 0;
          offsets[3].m_data[0] = 0;
          offsets[3].m_data[1] = 0;
          offsets[0].m_data[0] = 0;
          offsets[0].m_data[1] = 0;
          offsets[1].m_data[0] = 0;
          offsets[1].m_data[1] = 0;
          resultPix.m_data[1] = fVar10;
          resultPix.m_data[0] = fVar11;
          (**pPVar4->_vptr_PixelOffsets)(pPVar4,(Texture2DArrayView *)&resultPix,offsets);
          texCoord.m_data[0] = (float)(int)fVar11;
          texCoord.m_data[1] = local_464;
          tcu::operator+(0.5,(Vector<float,_2> *)&texCoord);
          viewportCoord.m_data[0] = fVar13;
          viewportCoord.m_data[1] = fVar13;
          tcu::operator/((Vector<float,_2> *)&resultPix,(Vector<float,_2> *)&viewportCoord);
          (anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,3>>
                    ((_anonymous_namespace_ *)&ideal,&texCoords,(float)errorMask.m_width,
                     (float)errorMask.m_height);
          tcu::ConstPixelBufferAccess::getPixelT<float>
                    ((ConstPixelBufferAccess *)&texCoord,(int)local_460,(int)fVar11,(int)fVar10);
          tcu::Texture2DArrayView::gatherOffsets
                    ((Texture2DArrayView *)&resultPix,(Sampler *)local_370,(float)ideal.m_width,
                     (float)ideal.m_height,ideal.m_pixels.m_ptr._0_4_,(int)&refColor,
                     (IVec2 (*) [4])(ulong)(uint)local_46c);
          tcu::Vector<float,_4>::cast<float>((Vector<float,_4> *)&viewportCoord);
          pSVar7 = (Surface *)(ulong)(uint)fVar10;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&idealPix,(Vector<float,_4> *)&viewportCoord,(int)fVar11,
                     (int)fVar10,0);
          tcu::absDiff<float,4>
                    ((tcu *)&resultPix,(Vector<float,_4> *)&texCoord,
                     (Vector<float,_4> *)&viewportCoord);
          tcu::Vector<float,_4>::cast<float>((Vector<float,_4> *)&local_418);
          tcu::greaterThan<float,4>
                    ((tcu *)&local_478,(Vector<float,_4> *)&resultPix,(Vector<float,_4> *)&local_418
                    );
          tcu::logicalAnd<bool,4>((tcu *)&local_474,local_308,&local_478);
          bVar5 = tcu::boolAny<4>(&local_474);
          if (bVar5) {
            pSVar7 = &ideal;
            bVar5 = tcu::isGatherOffsetsResultValid
                              ((Texture2DArrayView *)local_370,(Sampler *)&refColor,
                               (LookupPrecision *)&idealAccess,(Vec3 *)pSVar7,(int)local_46c,
                               &offsets,(Vec4 *)&texCoord);
            if (!bVar5) {
              *(undefined4 *)
               ((long)errorMask_1.m_pixels.m_ptr +
               (long)(errorMask_1.m_width * (int)fVar10 + (int)fVar11) * 4) = 0xff0000ff;
              local_470 = 0;
              pSVar7 = (Surface *)errorMask_1.m_pixels.m_ptr;
            }
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texCoord,"VerifyResult",(allocator<char> *)&errorMask);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&viewportCoord,"Verification result",(allocator<char> *)&local_474);
      uVar9 = local_470;
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)&resultPix,(string *)&texCoord,(string *)&viewportCoord);
      tcu::LogImageSet::write((LogImageSet *)&resultPix,__fd,__buf_03,(size_t)pSVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_418,"Rendered",(allocator<char> *)&local_478);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ideal,"Rendered image",&local_47e);
      pCVar8 = local_460;
      tcu::LogImage::LogImage
                ((LogImage *)offsets,&local_418,(string *)&ideal,local_460,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)offsets,__fd,__buf_04,(size_t)pCVar8);
      tcu::LogImage::~LogImage((LogImage *)offsets);
      std::__cxx11::string::~string((string *)&ideal);
      std::__cxx11::string::~string((string *)&local_418);
      tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultPix);
      std::__cxx11::string::~string((string *)&viewportCoord);
      std::__cxx11::string::~string((string *)&texCoord);
      if ((uVar9 & 1) == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord,"Reference",(allocator<char> *)&local_474);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"Ideal reference image",(allocator<char> *)&local_478);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&texCoord,(TextureLevel *)&comparePrec);
        pCVar8 = (ConstPixelBufferAccess *)&texCoord;
        tcu::LogImage::LogImage
                  ((LogImage *)offsets,(string *)&viewportCoord,&local_418,pCVar8,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)offsets,__fd,__buf_05,(size_t)pCVar8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&ideal,"ErrorMask",&local_47e);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&errorMask,"Error mask",&local_47d);
        pSVar7 = &errorMask_1;
        tcu::LogImage::LogImage
                  ((LogImage *)&resultPix,(string *)&ideal,(string *)&errorMask,pSVar7,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&resultPix,__fd,__buf_06,(size_t)pSVar7);
        tcu::LogImage::~LogImage((LogImage *)&resultPix);
        std::__cxx11::string::~string((string *)&errorMask);
        std::__cxx11::string::~string((string *)&ideal);
        tcu::LogImage::~LogImage((LogImage *)offsets);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&viewportCoord);
      }
      tcu::TestLog::endImageSet((TestLog *)this_01);
    }
    else {
LAB_005879c8:
      if (2 < CVar3 - SIGNED_INT8) {
LAB_00587cb6:
        uVar9 = 0;
        goto LAB_0058799d;
      }
LAB_00586e2b:
      tcu::IntLookupPrecision::IntLookupPrecision((IntLookupPrecision *)&idealAccess);
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)offsets,0);
      pPVar4 = local_2d8.
               super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
               .m_data.ptr;
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = offsets[0].m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = offsets[0].m_data[1];
      idealAccess.super_ConstPixelBufferAccess.m_data = (void *)offsets[1].m_data;
      idealAccess.super_ConstPixelBufferAccess.m_format.order = coordBits.m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_format.type = coordBits.m_data[1];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = coordBits.m_data[2];
      idealAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = uvwBits.m_data[2];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = uvwBits.m_data[0];
      idealAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = uvwBits.m_data[1];
      local_308[0].m_data[0] = true;
      local_308[0].m_data[1] = true;
      local_308[0].m_data[2] = true;
      local_308[0].m_data[3] = true;
      CVar3 = (this->super_TextureGatherCase).m_textureFormat.type;
      if (((ulong)CVar3 < 0x22) && ((0x2c0000000U >> ((ulong)CVar3 & 0x3f) & 1) != 0)) {
        local_47c = (float)(local_460->m_size).m_data[0];
        tcu::TextureLevel::TextureLevel
                  ((TextureLevel *)&comparePrec,&local_460->m_format,(int)local_47c,(int)local_47c,1
                  );
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&idealPix,(TextureLevel *)&comparePrec);
        tcu::Surface::Surface(&errorMask_1,(int)local_47c,(int)local_47c);
        tcu::Surface::getAccess((PixelBufferAccess *)offsets,&errorMask_1);
        texCoord.m_data[0] = -1.7146522e+38;
        tcu::RGBA::toVec((RGBA *)&texCoord);
        tcu::clear((PixelBufferAccess *)offsets,&resultPix);
        fVar13 = (float)(int)local_47c;
        fVar10 = 0.0;
        pSVar7 = (Surface *)0x0;
        if (0 < (int)local_47c) {
          pSVar7 = (Surface *)(ulong)(uint)local_47c;
        }
        local_468 = SUB84(pSVar7,0);
        local_470 = (uint)CONCAT71((uint7)(uint3)((uint)local_47c >> 8),1);
        for (; fVar10 != local_468; fVar10 = (float)((int)fVar10 + 1)) {
          local_464 = (float)(int)fVar10;
          for (fVar11 = 0.0; local_47c != fVar11; fVar11 = (float)((int)fVar11 + 1)) {
            offsets[2].m_data[0] = 0;
            offsets[2].m_data[1] = 0;
            offsets[3].m_data[0] = 0;
            offsets[3].m_data[1] = 0;
            offsets[0].m_data[0] = 0;
            offsets[0].m_data[1] = 0;
            offsets[1].m_data[0] = 0;
            offsets[1].m_data[1] = 0;
            resultPix.m_data[1] = fVar10;
            resultPix.m_data[0] = fVar11;
            (**pPVar4->_vptr_PixelOffsets)(pPVar4,(Texture2DArrayView *)&resultPix,offsets);
            texCoord.m_data[0] = (float)(int)fVar11;
            texCoord.m_data[1] = local_464;
            tcu::operator+(0.5,(Vector<float,_2> *)&texCoord);
            viewportCoord.m_data[0] = fVar13;
            viewportCoord.m_data[1] = fVar13;
            tcu::operator/((Vector<float,_2> *)&resultPix,(Vector<float,_2> *)&viewportCoord);
            (anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,3>>
                      ((_anonymous_namespace_ *)&ideal,&texCoords,(float)errorMask.m_width,
                       (float)errorMask.m_height);
            tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                      ((ConstPixelBufferAccess *)&texCoord,(int)local_460,(int)fVar11,(int)fVar10);
            tcu::Texture2DArrayView::gatherOffsets
                      ((Texture2DArrayView *)&resultPix,(Sampler *)local_370,(float)ideal.m_width,
                       (float)ideal.m_height,ideal.m_pixels.m_ptr._0_4_,(int)&refColor,
                       (IVec2 (*) [4])(ulong)(uint)local_46c);
            tcu::Vector<float,_4>::cast<unsigned_int>((Vector<float,_4> *)&viewportCoord);
            pSVar7 = (Surface *)(ulong)(uint)fVar10;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&idealPix,(UVec4 *)&viewportCoord,(int)fVar11,
                       (int)fVar10,0);
            tcu::absDiff<unsigned_int,4>
                      ((tcu *)&resultPix,(Vector<unsigned_int,_4> *)&texCoord,
                       (Vector<unsigned_int,_4> *)&viewportCoord);
            tcu::Vector<unsigned_int,_4>::cast<unsigned_int>((Vector<unsigned_int,_4> *)&local_418);
            tcu::greaterThan<unsigned_int,4>
                      ((tcu *)&local_478,(Vector<unsigned_int,_4> *)&resultPix,
                       (Vector<unsigned_int,_4> *)&local_418);
            tcu::logicalAnd<bool,4>((tcu *)&local_474,local_308,&local_478);
            bVar5 = tcu::boolAny<4>(&local_474);
            if (bVar5) {
              pSVar7 = &ideal;
              bVar5 = tcu::isGatherOffsetsResultValid
                                ((Texture2DArrayView *)local_370,(Sampler *)&refColor,
                                 (IntLookupPrecision *)&idealAccess,(Vec3 *)pSVar7,(int)local_46c,
                                 &offsets,(UVec4 *)&texCoord);
              if (!bVar5) {
                *(undefined4 *)
                 ((long)errorMask_1.m_pixels.m_ptr +
                 (long)(errorMask_1.m_width * (int)fVar10 + (int)fVar11) * 4) = 0xff0000ff;
                local_470 = 0;
                pSVar7 = (Surface *)errorMask_1.m_pixels.m_ptr;
              }
            }
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texCoord,"VerifyResult",(allocator<char> *)&errorMask);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord,"Verification result",(allocator<char> *)&local_474);
        uVar9 = local_470;
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)&resultPix,(string *)&texCoord,(string *)&viewportCoord);
        tcu::LogImageSet::write((LogImageSet *)&resultPix,__fd,__buf_07,(size_t)pSVar7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"Rendered",(allocator<char> *)&local_478);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ideal,"Rendered image",&local_47e);
        pCVar8 = local_460;
        tcu::LogImage::LogImage
                  ((LogImage *)offsets,&local_418,(string *)&ideal,local_460,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)offsets,__fd,__buf_08,(size_t)pCVar8);
        tcu::LogImage::~LogImage((LogImage *)offsets);
        std::__cxx11::string::~string((string *)&ideal);
        std::__cxx11::string::~string((string *)&local_418);
        tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultPix);
        std::__cxx11::string::~string((string *)&viewportCoord);
        std::__cxx11::string::~string((string *)&texCoord);
        if ((uVar9 & 1) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&viewportCoord,"Reference",(allocator<char> *)&local_474);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_418,"Ideal reference image",(allocator<char> *)&local_478);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&texCoord,(TextureLevel *)&comparePrec);
          pCVar8 = (ConstPixelBufferAccess *)&texCoord;
          tcu::LogImage::LogImage
                    ((LogImage *)offsets,(string *)&viewportCoord,&local_418,pCVar8,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)offsets,__fd,__buf_09,(size_t)pCVar8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ideal,"ErrorMask",&local_47e);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&errorMask,"Error mask",&local_47d);
          pSVar7 = &errorMask_1;
          tcu::LogImage::LogImage
                    ((LogImage *)&resultPix,(string *)&ideal,(string *)&errorMask,pSVar7,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&resultPix,__fd,__buf_10,(size_t)pSVar7);
          tcu::LogImage::~LogImage((LogImage *)&resultPix);
          std::__cxx11::string::~string((string *)&errorMask);
          std::__cxx11::string::~string((string *)&ideal);
          tcu::LogImage::~LogImage((LogImage *)offsets);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&viewportCoord);
        }
        tcu::TestLog::endImageSet((TestLog *)this_01);
      }
      else {
        if (2 < CVar3 - SIGNED_INT8) goto LAB_00587cb6;
        local_47c = (float)(local_460->m_size).m_data[0];
        tcu::TextureLevel::TextureLevel
                  ((TextureLevel *)&comparePrec,&local_460->m_format,(int)local_47c,(int)local_47c,1
                  );
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&idealPix,(TextureLevel *)&comparePrec);
        tcu::Surface::Surface(&errorMask_1,(int)local_47c,(int)local_47c);
        tcu::Surface::getAccess((PixelBufferAccess *)offsets,&errorMask_1);
        texCoord.m_data[0] = -1.7146522e+38;
        tcu::RGBA::toVec((RGBA *)&texCoord);
        tcu::clear((PixelBufferAccess *)offsets,&resultPix);
        fVar13 = (float)(int)local_47c;
        fVar10 = 0.0;
        pSVar7 = (Surface *)0x0;
        if (0 < (int)local_47c) {
          pSVar7 = (Surface *)(ulong)(uint)local_47c;
        }
        local_468 = SUB84(pSVar7,0);
        local_470 = (uint)CONCAT71((uint7)(uint3)((uint)local_47c >> 8),1);
        for (; fVar10 != local_468; fVar10 = (float)((int)fVar10 + 1)) {
          local_464 = (float)(int)fVar10;
          for (fVar11 = 0.0; local_47c != fVar11; fVar11 = (float)((int)fVar11 + 1)) {
            offsets[2].m_data[0] = 0;
            offsets[2].m_data[1] = 0;
            offsets[3].m_data[0] = 0;
            offsets[3].m_data[1] = 0;
            offsets[0].m_data[0] = 0;
            offsets[0].m_data[1] = 0;
            offsets[1].m_data[0] = 0;
            offsets[1].m_data[1] = 0;
            resultPix.m_data[1] = fVar10;
            resultPix.m_data[0] = fVar11;
            (**pPVar4->_vptr_PixelOffsets)(pPVar4,(Texture2DArrayView *)&resultPix,offsets);
            texCoord.m_data[0] = (float)(int)fVar11;
            texCoord.m_data[1] = local_464;
            tcu::operator+(0.5,(Vector<float,_2> *)&texCoord);
            viewportCoord.m_data[0] = fVar13;
            viewportCoord.m_data[1] = fVar13;
            tcu::operator/((Vector<float,_2> *)&resultPix,(Vector<float,_2> *)&viewportCoord);
            (anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,3>>
                      ((_anonymous_namespace_ *)&ideal,&texCoords,(float)errorMask.m_width,
                       (float)errorMask.m_height);
            tcu::ConstPixelBufferAccess::getPixelT<int>
                      ((ConstPixelBufferAccess *)&texCoord,(int)local_460,(int)fVar11,(int)fVar10);
            tcu::Texture2DArrayView::gatherOffsets
                      ((Texture2DArrayView *)&resultPix,(Sampler *)local_370,(float)ideal.m_width,
                       (float)ideal.m_height,ideal.m_pixels.m_ptr._0_4_,(int)&refColor,
                       (IVec2 (*) [4])(ulong)(uint)local_46c);
            tcu::Vector<float,_4>::cast<int>((Vector<float,_4> *)&viewportCoord);
            pSVar7 = (Surface *)(ulong)(uint)fVar10;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&idealPix,(IVec4 *)&viewportCoord,(int)fVar11,
                       (int)fVar10,0);
            tcu::absDiff<int,4>((tcu *)&resultPix,(Vector<int,_4> *)&texCoord,
                                (Vector<int,_4> *)&viewportCoord);
            tcu::Vector<unsigned_int,_4>::cast<int>((Vector<unsigned_int,_4> *)&local_418);
            tcu::greaterThan<int,4>
                      ((tcu *)&local_478,(Vector<int,_4> *)&resultPix,(Vector<int,_4> *)&local_418);
            tcu::logicalAnd<bool,4>((tcu *)&local_474,local_308,&local_478);
            bVar5 = tcu::boolAny<4>(&local_474);
            if (bVar5) {
              pSVar7 = &ideal;
              bVar5 = tcu::isGatherOffsetsResultValid
                                ((Texture2DArrayView *)local_370,(Sampler *)&refColor,
                                 (IntLookupPrecision *)&idealAccess,(Vec3 *)pSVar7,(int)local_46c,
                                 &offsets,(IVec4 *)&texCoord);
              if (!bVar5) {
                *(undefined4 *)
                 ((long)errorMask_1.m_pixels.m_ptr +
                 (long)(errorMask_1.m_width * (int)fVar10 + (int)fVar11) * 4) = 0xff0000ff;
                local_470 = 0;
                pSVar7 = (Surface *)errorMask_1.m_pixels.m_ptr;
              }
            }
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&texCoord,"VerifyResult",(allocator<char> *)&errorMask);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&viewportCoord,"Verification result",(allocator<char> *)&local_474);
        uVar9 = local_470;
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)&resultPix,(string *)&texCoord,(string *)&viewportCoord);
        tcu::LogImageSet::write((LogImageSet *)&resultPix,__fd,__buf_11,(size_t)pSVar7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"Rendered",(allocator<char> *)&local_478);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ideal,"Rendered image",&local_47e);
        pCVar8 = local_460;
        tcu::LogImage::LogImage
                  ((LogImage *)offsets,&local_418,(string *)&ideal,local_460,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)offsets,__fd,__buf_12,(size_t)pCVar8);
        tcu::LogImage::~LogImage((LogImage *)offsets);
        std::__cxx11::string::~string((string *)&ideal);
        std::__cxx11::string::~string((string *)&local_418);
        tcu::LogImageSet::~LogImageSet((LogImageSet *)&resultPix);
        std::__cxx11::string::~string((string *)&viewportCoord);
        std::__cxx11::string::~string((string *)&texCoord);
        if ((uVar9 & 1) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&viewportCoord,"Reference",(allocator<char> *)&local_474);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_418,"Ideal reference image",(allocator<char> *)&local_478);
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)&texCoord,(TextureLevel *)&comparePrec);
          pCVar8 = (ConstPixelBufferAccess *)&texCoord;
          tcu::LogImage::LogImage
                    ((LogImage *)offsets,(string *)&viewportCoord,&local_418,pCVar8,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)offsets,__fd,__buf_13,(size_t)pCVar8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ideal,"ErrorMask",&local_47e);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&errorMask,"Error mask",&local_47d);
          pSVar7 = &errorMask_1;
          tcu::LogImage::LogImage
                    ((LogImage *)&resultPix,(string *)&ideal,(string *)&errorMask,pSVar7,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&resultPix,__fd,__buf_14,(size_t)pSVar7);
          tcu::LogImage::~LogImage((LogImage *)&resultPix);
          std::__cxx11::string::~string((string *)&errorMask);
          std::__cxx11::string::~string((string *)&ideal);
          tcu::LogImage::~LogImage((LogImage *)offsets);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&viewportCoord);
        }
        tcu::TestLog::endImageSet((TestLog *)this_01);
      }
    }
    tcu::Surface::~Surface(&errorMask_1);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&comparePrec);
  }
LAB_0058799d:
  if (local_2d8.
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
      .m_data.ptr != (PixelOffsets *)0x0) {
    (*(local_2d8.
       super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
       .m_data.ptr)->_vptr_PixelOffsets[2])();
  }
LAB_005879b0:
  return uVar9 & 0xffffff01;
}

Assistant:

bool TextureGather2DArrayCase::verify (int iterationNdx, const ConstPixelBufferAccess& rendered) const
{
	Vec3 texCoords[4];
	computeTexCoordVecs(computeQuadTexCoord(iterationNdx), texCoords);
	return TextureGatherCase::verify(rendered, getOneLevelSubView(tcu::Texture2DArrayView(m_swizzledTexture), m_baseLevel), texCoords, m_iterations[iterationNdx].gatherArgs);
}